

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

bool search::isRepetition(Board *pos)

{
  vector<board::Undo,_std::allocator<board::Undo>_> *__x;
  int iVar1;
  uint64_t uVar2;
  pointer pUVar3;
  pointer pUVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  vector<board::Undo,_std::allocator<board::Undo>_> local_68;
  Board *local_50;
  uint64_t local_48;
  long local_40;
  ulong local_38;
  
  __x = &pos->history;
  std::vector<board::Undo,_std::allocator<board::Undo>_>::vector(&local_68,__x);
  lVar5 = (long)local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  iVar1 = pos->fiftyMove;
  local_50 = pos;
  if (local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar7 = lVar5 * 8 + (long)iVar1 * -0x18 + 0x10;
  uVar8 = lVar5 * -0x5555555555555555 - (long)iVar1;
  do {
    std::vector<board::Undo,_std::allocator<board::Undo>_>::vector(&local_68,__x);
    pUVar4 = local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pUVar3 = local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar6 = ((long)pUVar4 - (long)pUVar3 >> 3) * -0x5555555555555555;
    uVar9 = uVar8;
    if (uVar6 <= uVar8) break;
    local_40 = lVar7 + 0x18;
    local_48 = local_50->hashKey;
    std::vector<board::Undo,_std::allocator<board::Undo>_>::vector(&local_68,__x);
    uVar2 = *(uint64_t *)
             ((long)&(local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl
                      .super__Vector_impl_data._M_start)->castlePerm + lVar7);
    local_38 = uVar8;
    operator_delete(local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    lVar7 = local_40;
    uVar8 = uVar8 + 1;
    uVar9 = local_38;
  } while (local_48 != uVar2);
  return uVar9 < uVar6;
}

Assistant:

bool search::isRepetition(board::Board& pos)
{
    for (size_t i = pos.getHistory().size() - pos.getFiftyMove(); i < pos.getHistory().size(); i++) {
        if (pos.getHashKey() == pos.getHistory()[i].getHashKey()) {
            return true;
        }
    }
    return false;
}